

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::uniform(DenseMatrix *this,real a)

{
  int64_t i;
  long lVar1;
  undefined1 auVar2 [16];
  result_type_conflict rVar3;
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  minstd_rand rng;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> local_40;
  param_type local_38;
  
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = a;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(auVar4._0_16_,auVar2);
  lVar1 = 0;
  local_40._M_x = 1;
  auVar2 = vinsertps_avx(auVar2,auVar4._0_16_,0x1c);
  local_38 = (param_type)vcvtps2pd_avx(auVar2);
  for (; lVar1 < (this->super_Matrix).n_ * (this->super_Matrix).m_; lVar1 = lVar1 + 1) {
    rVar3 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)&local_38,&local_40);
    (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar1] = (float)rVar3;
  }
  return;
}

Assistant:

void DenseMatrix::uniform(real a) {
  std::minstd_rand rng(1);
  std::uniform_real_distribution<> uniform(-a, a);
  for (int64_t i = 0; i < (m_ * n_); i++) {
    data_[i] = uniform(rng);
  }
}